

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O1

int i2d_EC_PUBKEY(EC_KEY *a,uchar **pp)

{
  int iVar1;
  int iVar2;
  EVP_PKEY *pkey;
  
  if (a == (EC_KEY *)0x0) {
    iVar2 = 0;
  }
  else {
    pkey = EVP_PKEY_new();
    iVar2 = -1;
    if (pkey != (EVP_PKEY *)0x0) {
      iVar1 = EVP_PKEY_set1_EC_KEY(pkey,a);
      if (iVar1 != 0) {
        iVar2 = i2d_PUBKEY(pkey,pp);
      }
    }
    if (pkey != (EVP_PKEY *)0x0) {
      EVP_PKEY_free(pkey);
    }
  }
  return iVar2;
}

Assistant:

int i2d_EC_PUBKEY(const EC_KEY *ec_key, uint8_t **outp) {
  if (ec_key == NULL) {
    return 0;
  }

  bssl::UniquePtr<EVP_PKEY> pkey(EVP_PKEY_new());
  if (pkey == nullptr ||
      !EVP_PKEY_set1_EC_KEY(pkey.get(), const_cast<EC_KEY *>(ec_key))) {
    return -1;
  }

  return i2d_PUBKEY(pkey.get(), outp);
}